

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,GlobalFederateId federateID)

{
  bool bVar1;
  FedInfo *pFVar2;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_RDI;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
  *in_stack_ffffffffffffffa8;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffb0;
  FederateState *pFVar3;
  GlobalFederateId *in_stack_ffffffffffffffe8;
  
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (in_RDI,in_stack_ffffffffffffffe8);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::end
            (in_stack_ffffffffffffffb0);
  bVar1 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                    ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    pFVar2 = gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator->
                       ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)
                        &stack0xffffffffffffffd8);
    pFVar3 = pFVar2->fed;
  }
  else {
    pFVar3 = (FederateState *)0x0;
  }
  return pFVar3;
}

Assistant:

FederateState* CommonCore::getFederateCore(GlobalFederateId federateID)
{
    auto fed = loopFederates.find(federateID);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}